

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_textedit_init_default(nk_text_edit *state)

{
  nk_text_edit *__s;
  size_t __n;
  size_t __n_00;
  nk_handle local_38;
  code *local_30;
  code *local_28;
  
  if (state != (nk_text_edit *)0x0) {
    __n = (ulong)state & 3;
    if (__n == 0) {
      __n = 0x1500;
      __s = state;
    }
    else {
      __n_00 = -__n + 4;
      memset(state,0,__n_00);
      memset((void *)((long)state + __n_00),0,0x1504);
      __s = (nk_text_edit *)((long)state + -__n + 0x1508);
    }
    memset(__s,0,__n);
    (state->undo).undo_point = 0;
    (state->undo).redo_point = 99;
    (state->undo).undo_char_point = 0;
    (state->undo).redo_char_point = 999;
    state->cursor = 0;
    state->select_start = 0;
    state->select_end = 0;
    state->mode = '\0';
    state->cursor_at_end_of_line = '\0';
    state->initialized = '\x01';
    state->has_preferred_x = '\0';
    state->preferred_x = 0.0;
    state->single_line = '\x01';
    state->filter = (nk_plugin_filter)0x0;
    (state->scrollbar).x = 0.0;
    (state->scrollbar).y = 0.0;
    local_38.ptr = (void *)0x0;
    local_30 = nk_malloc;
    local_28 = nk_mfree;
    nk_buffer_init(&(state->string).buffer,(nk_allocator *)&local_38,0x20);
    (state->string).len = 0;
    return;
  }
  __assert_fail("state",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x58a9,"void nk_textedit_init_default(struct nk_text_edit *)");
}

Assistant:

NK_API void
nk_textedit_init_default(struct nk_text_edit *state)
{
    NK_ASSERT(state);
    if (!state) return;
    NK_MEMSET(state, 0, sizeof(struct nk_text_edit));
    nk_textedit_clear_state(state, NK_TEXT_EDIT_SINGLE_LINE, 0);
    nk_str_init_default(&state->string);
}